

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlDictPtr xmlDictCreate(void)

{
  uint uVar1;
  xmlDictPtr pxVar2;
  
  xmlInitParser();
  pxVar2 = (xmlDictPtr)(*xmlMalloc)(0x40);
  if (pxVar2 != (xmlDictPtr)0x0) {
    pxVar2->ref_counter = 1;
    pxVar2->limit = 0;
    pxVar2->table = (xmlDictEntry *)0x0;
    pxVar2->size = 0;
    pxVar2->nbElems = 0;
    pxVar2->strings = (xmlDictStringsPtr_conflict)0x0;
    pxVar2->subdict = (_xmlDict *)0x0;
    uVar1 = xmlRandom();
    pxVar2->seed = uVar1;
  }
  return pxVar2;
}

Assistant:

xmlDictPtr
xmlDictCreate(void) {
    xmlDictPtr dict;

    xmlInitParser();

    dict = xmlMalloc(sizeof(xmlDict));
    if (dict == NULL)
        return(NULL);
    dict->ref_counter = 1;
    dict->limit = 0;

    dict->size = 0;
    dict->nbElems = 0;
    dict->table = NULL;
    dict->strings = NULL;
    dict->subdict = NULL;
    dict->seed = xmlRandom();
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dict->seed = 0;
#endif
    return(dict);
}